

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

string * __thiscall leveldb::InternalKey::DebugString_abi_cxx11_(InternalKey *this)

{
  bool bVar1;
  string *s;
  string *in_RDI;
  ostringstream ss;
  ParsedInternalKey parsed;
  string *in_stack_fffffffffffffdf8;
  string *value;
  ParsedInternalKey *in_stack_fffffffffffffe20;
  Slice *in_stack_fffffffffffffe28;
  ostringstream local_1b8 [400];
  ParsedInternalKey *in_stack_ffffffffffffffd8;
  
  value = in_RDI;
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)0x11881e);
  Slice::Slice((Slice *)in_RDI,in_stack_fffffffffffffdf8);
  bVar1 = ParseInternalKey(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (bVar1) {
    ParsedInternalKey::DebugString_abi_cxx11_(in_stack_ffffffffffffffd8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    s = (string *)std::operator<<((ostream *)local_1b8,"(bad)");
    Slice::Slice((Slice *)in_RDI,s);
    EscapeString_abi_cxx11_((Slice *)value);
    std::operator<<((ostream *)s,(string *)&stack0xfffffffffffffe28);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return value;
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}